

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedNumber *FN)

{
  uint uVar1;
  undefined8 in_R9;
  Optional<unsigned_long> Width;
  undefined1 local_68 [8];
  raw_svector_ostream Stream;
  SmallString<16U> Buffer;
  
  if (FN->Hex == true) {
    uVar1 = (uint)FN->HexPrefix * 2;
    if (FN->Upper == false) {
      uVar1 = (uint)FN->HexPrefix * 2 + 1;
    }
    Width.Storage._8_8_ = in_R9;
    Width.Storage.field_0.value = 1;
    llvm::write_hex((llvm *)this,(raw_ostream *)FN->HexValue,(ulong)uVar1,FN->Width,Width);
  }
  else {
    Stream.OS = (SmallVectorImpl<char> *)
                &Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x1000000000;
    raw_svector_ostream::raw_svector_ostream
              ((raw_svector_ostream *)local_68,(SmallVectorImpl<char> *)&Stream.OS);
    write_integer((raw_ostream *)local_68,FN->DecValue,0,Integer);
    uVar1 = FN->Width -
            (uint)Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                  super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if ((uint)Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX <= FN->Width && uVar1 != 0) {
      indent(this,uVar1);
    }
    operator<<(this,(SmallVectorImpl<char> *)&Stream.OS);
    ~raw_ostream((raw_ostream *)local_68);
    SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&Stream.OS);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedNumber &FN) {
  if (FN.Hex) {
    HexPrintStyle Style;
    if (FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixUpper;
    else if (FN.Upper && !FN.HexPrefix)
      Style = HexPrintStyle::Upper;
    else if (!FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixLower;
    else
      Style = HexPrintStyle::Lower;
    llvm::write_hex(*this, FN.HexValue, Style, FN.Width);
  } else {
    llvm::SmallString<16> Buffer;
    llvm::raw_svector_ostream Stream(Buffer);
    llvm::write_integer(Stream, FN.DecValue, 0, IntegerStyle::Integer);
    if (Buffer.size() < FN.Width)
      indent(FN.Width - Buffer.size());
    (*this) << Buffer;
  }
  return *this;
}